

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O0

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
TypesHierarchy::GetCompositesForTypes
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,TypesHierarchy *this,TYPE_ID type)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference puVar5;
  value_type_conflict4 local_7c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  uint *local_70;
  ulong local_68;
  size_t i;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tmp;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  iterator it2;
  TYPE_ID type_local;
  TypesHierarchy *this_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *vect;
  
  it2._M_current._4_4_ = type;
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
  __normal_iterator(&local_28);
  tmp._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (__return_storage_ptr__);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&i);
  local_68 = (ulong)this->CompositeStartFrom;
  while( true ) {
    uVar1 = local_68;
    sVar3 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(&this->types);
    if (sVar3 <= uVar1) break;
    pvVar4 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->types,local_68);
    local_70 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar4);
    local_28._M_current = local_70;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->types,local_68);
      local_78._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar4);
      bVar2 = __gnu_cxx::operator!=(&local_28,&local_78);
      if (!bVar2) break;
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_28);
      if (*puVar5 == it2._M_current._4_4_) {
        local_7c = (value_type_conflict4)local_68;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                  (__return_storage_ptr__,&local_7c);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_28,0);
    }
    local_68 = local_68 + 1;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
            (__return_storage_ptr__,(value_type_conflict4 *)((long)&it2._M_current + 4));
  tmp._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&i);
  if ((tmp._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

set<TYPE_ID> TypesHierarchy::GetCompositesForTypes(TYPE_ID type) {
	vector<TYPE_ID>::iterator it2;
	set<TYPE_ID> vect;
	set<TYPE_ID> tmp;

	for (size_t i = CompositeStartFrom; i < types.size(); i++) {
		for (it2 = types[i].begin(); it2 != types[i].end(); it2++) {
			if (*it2 == type) {
//				cerr << i << endl;
//				tmp = GetGenericTypes(*it2);
//				vect.insert( tmp.begin(), tmp.end() );
				vect.insert(i);
			}
		}
	}
	vect.insert(type);
	return vect;
}